

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  String *pSVar1;
  code *pcVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint32 uVar6;
  int *piVar7;
  char *pcVar8;
  char **in_RCX;
  char **ppcVar9;
  long lVar10;
  char *pcVar11;
  long *extraout_RDX;
  char **ppcVar12;
  char **__file_00;
  Process *this_00;
  uint in_R8D;
  String *this_01;
  undefined8 uStack_50;
  undefined8 local_48;
  int stdoutFds [2];
  int stderrFds [2];
  int stdinFds [2];
  
  ppcVar12 = (char **)&local_48;
  if (this->pid != 0) {
    uStack_50 = 0x1117f0;
    piVar7 = __errno_location();
    *piVar7 = 0x16;
    return 0;
  }
  local_48 = 0;
  stdoutFds[0] = 0;
  stdoutFds[1] = 0;
  stderrFds[0] = 0;
  stderrFds[1] = 0;
  ppcVar9 = in_RCX;
  if ((in_R8D & 1) == 0) {
LAB_0011182d:
    uVar5 = (uint)ppcVar9;
    if ((in_R8D & 2) != 0) {
      uStack_50 = 0x11183c;
      iVar4 = pipe(stdoutFds);
      if (iVar4 != 0) goto LAB_00111853;
    }
    if ((in_R8D & 4) != 0) {
      uStack_50 = 0x11184f;
      iVar4 = pipe(stderrFds);
      if (iVar4 != 0) goto LAB_00111853;
    }
    if ((__oflag == 0) ||
       (ppcVar9 = (char **)(ulong)(uint)__oflag, in_RCX[(long)__oflag + -1] != (char *)0x0)) {
      uVar5 = __oflag + (uint)(__oflag == 0);
      lVar10 = (long)(int)uVar5;
      lVar3 = -(lVar10 * 8 + 0x17U & 0xfffffffffffffff0);
      ppcVar12 = (char **)((long)stdoutFds + lVar3 + -8);
      ppcVar12[lVar10] = (char *)0x0;
      if (1 < (int)uVar5) {
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x11190a;
        memcpy((void *)((long)stdoutFds + lVar3),in_RCX + 1,(ulong)(uVar5 - 1) << 3);
        uVar5 = (uint)lVar10;
      }
      *(undefined8 *)((long)&uStack_50 + lVar3) = 0x111912;
      pcVar8 = String::operator_cast_to_char_((String *)__file);
      *ppcVar12 = pcVar8;
      ppcVar9 = ppcVar12;
      in_RCX = ppcVar12;
    }
    ppcVar12[-1] = (char *)0x11191e;
    uVar6 = vfork();
    if (uVar6 != 0xffffffff) {
      iVar4 = local_48._4_4_;
      if (uVar6 != 0) {
        this->pid = uVar6;
        if (local_48._4_4_ != 0) {
          ppcVar12[-1] = (char *)0x1119f0;
          ::close(iVar4);
        }
        iVar4 = stdoutFds[1];
        if (stdoutFds[1] != 0) {
          ppcVar12[-1] = (char *)0x1119fc;
          ::close(iVar4);
        }
        iVar4 = stderrFds[0];
        if (stderrFds[0] != 0) {
          ppcVar12[-1] = (char *)0x111a08;
          ::close(iVar4);
        }
        this->fdStdOutRead = (int)local_48;
        this->fdStdErrRead = stdoutFds[0];
        this->fdStdInWrite = stderrFds[1];
        return (int)CONCAT71((int7)((ulong)__file >> 8),1);
      }
      if (local_48._4_4_ != 0) {
        ppcVar12[-1] = (char *)0x111940;
        dup2(iVar4,1);
        iVar4 = local_48._4_4_;
        ppcVar12[-1] = (char *)0x111948;
        ::close(iVar4);
      }
      iVar4 = stdoutFds[1];
      if (stdoutFds[1] != 0) {
        ppcVar12[-1] = (char *)0x111959;
        dup2(iVar4,2);
        iVar4 = stdoutFds[1];
        ppcVar12[-1] = (char *)0x111961;
        ::close(iVar4);
      }
      iVar4 = stderrFds[0];
      if (stderrFds[0] != 0) {
        ppcVar12[-1] = (char *)0x11196f;
        dup2(iVar4,0);
        iVar4 = stderrFds[0];
        ppcVar12[-1] = (char *)0x111977;
        ::close(iVar4);
      }
      iVar4 = (int)local_48;
      if ((int)local_48 != 0) {
        ppcVar12[-1] = (char *)0x111983;
        ::close(iVar4);
      }
      iVar4 = stdoutFds[0];
      if (stdoutFds[0] != 0) {
        ppcVar12[-1] = (char *)0x11198f;
        ::close(iVar4);
      }
      iVar4 = stderrFds[1];
      if (stderrFds[1] != 0) {
        ppcVar12[-1] = (char *)0x11199b;
        ::close(iVar4);
      }
      ppcVar12[-1] = (char *)0x1119a3;
      pcVar8 = String::operator_cast_to_char_((String *)__file);
      ppcVar12[-1] = (char *)0x1119ae;
      __file_00 = in_RCX;
      iVar4 = execvp(pcVar8,in_RCX);
      if (iVar4 != -1) {
        ppcVar12[-1] = (char *)0x1119d6;
        iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Process.cpp"
                              ,0x2a5,"false");
        if (iVar4 == 0) {
          return 0;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ppcVar12[-1] = (char *)0x111a2b;
      this_00 = (Process *)__file;
      open(__file,(int)__file_00);
      ppcVar12[-1] = &stack0xfffffffffffffff8;
      ppcVar12[-2] = (char *)in_RCX;
      ppcVar12[-3] = (char *)this;
      ppcVar12[-4] = (char *)(ulong)in_R8D;
      ppcVar12[-5] = (char *)ppcVar9;
      ppcVar12[-6] = __file;
      pcVar8 = (char *)extraout_RDX[2];
      ppcVar12[-0xb] = (char *)0x0;
      ppcVar12[-10] = (char *)0x0;
      ppcVar12[-9] = pcVar8;
      pSVar1 = (String *)*extraout_RDX;
      this_01 = (String *)extraout_RDX[1];
      if (this_01 == pSVar1) {
        pcVar11 = (char *)0x0;
      }
      else {
        ppcVar12[-7] = (char *)__file_00;
        *(uint *)((long)ppcVar12 + -0x5c) = uVar5;
        do {
          ppcVar12[-0xe] = (char *)0x111a7d;
          pcVar8 = String::operator_cast_to_char_(this_01);
          ppcVar12[-0xe] = (char *)0x111a99;
          Array<const_char_*>::reserve
                    ((Array<const_char_*> *)(ppcVar12 + -0xb),
                     ((long)ppcVar12[-10] - (long)ppcVar12[-0xb] >> 3) + 1);
          *(char **)ppcVar12[-10] = pcVar8;
          ppcVar12[-10] = ppcVar12[-10] + 8;
          this_01 = (String *)this_01[1]._data.str;
        } while (this_01 != pSVar1);
        pcVar8 = (char *)extraout_RDX[2];
        pcVar11 = ppcVar12[-0xb];
        uVar5 = *(uint *)((long)ppcVar12 + -0x5c);
        __file_00 = (char **)ppcVar12[-7];
      }
      ppcVar12[-0xe] = (char *)0x111acc;
      iVar4 = open(this_00,(char *)__file_00,(int)pcVar8,pcVar11,(ulong)uVar5);
      if (ppcVar12[-0xb] != (char *)0x0) {
        ppcVar12[-0xe] = (char *)0x111add;
        operator_delete__(ppcVar12[-0xb]);
      }
      return iVar4;
    }
  }
  else {
    uStack_50 = 0x111829;
    iVar4 = pipe((int *)&local_48);
    if (iVar4 == 0) goto LAB_0011182d;
LAB_00111853:
    uStack_50 = 0x111858;
    piVar7 = __errno_location();
    iVar4 = *piVar7;
    if ((int)local_48 != 0) {
      uStack_50 = 0x11186a;
      ::close((int)local_48);
      uStack_50 = 0x111872;
      ::close(local_48._4_4_);
    }
    if (stdoutFds[0] != 0) {
      uStack_50 = 0x11187e;
      ::close(stdoutFds[0]);
      uStack_50 = 0x111886;
      ::close(stdoutFds[1]);
    }
    if (stderrFds[0] != 0) {
      uStack_50 = 0x111892;
      ::close(stderrFds[0]);
      uStack_50 = 0x11189a;
      ::close(stderrFds[1]);
    }
    *piVar7 = iVar4;
  }
  return 0;
}

Assistant:

bool Process::open(const String& executable, int argc, char* const argv[], uint streams)
{
#ifdef _WIN32
  return open(Private::getCommandLine(executable, argc, argv), streams);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // create pipes
  int stdoutFds[2] = {};
  int stderrFds[2] = {};
  int stdinFds[2] = {};
  if (streams & stdoutStream)
  {
    if (pipe(stdoutFds) != 0)
      goto error;
  }
  if (streams & stderrStream)
  {
    if (pipe(stderrFds) != 0)
      goto error;
  }
  if (streams & stdinStream)
  {
    if (pipe(stdinFds) != 0)
      goto error;
  }

  // prepare argv of child
  const char** args;
  if (argc && !argv[argc - 1])
    args = (const char**)argv;
  else
  {
    if (!argc)
      ++argc;
    args = (const char**)alloca(sizeof(const char*) * (argc + 1));
    args[argc] = 0;
    for (int i = 1; i < argc; ++i)
      args[i] = argv[i];
    args[0] = executable;
  }

  // start process
  {
    int r = vfork();
    if (r == -1)
      return false;
    else if (r != 0) // parent
    {
      pid = r;

      if (stdoutFds[1])
        ::close(stdoutFds[1]);
      if (stderrFds[1])
        ::close(stderrFds[1]);
      if (stdinFds[0])
        ::close(stdinFds[0]);

      fdStdOutRead = stdoutFds[0];
      fdStdErrRead = stderrFds[0];
      fdStdInWrite = stdinFds[1];

      return true;
    }
    else // child
    {
      if (stdoutFds[1])
      {
        dup2(stdoutFds[1], STDOUT_FILENO);
        ::close(stdoutFds[1]);
      }
      if (stderrFds[1])
      {
        dup2(stderrFds[1], STDERR_FILENO);
        ::close(stderrFds[1]);
      }
      if (stdinFds[0])
      {
        dup2(stdinFds[0], STDIN_FILENO);
        ::close(stdinFds[0]);
      }

      if (stdoutFds[0])
        ::close(stdoutFds[0]);
      if (stderrFds[0])
        ::close(stderrFds[0]);
      if (stdinFds[1])
        ::close(stdinFds[1]);

      if (execvp(executable, (char* const*)args) == -1)
      {
        fprintf(stderr, "%s: %s\n", (const char*)executable, strerror(errno));
        _exit(EXIT_FAILURE);
      }
      ASSERT(false); // unreachable
      return false;
    }
  }
error:
  int err = errno;
  if (stdoutFds[0])
  {
    ::close(stdoutFds[0]);
    ::close(stdoutFds[1]);
  }
  if (stderrFds[0])
  {
    ::close(stderrFds[0]);
    ::close(stderrFds[1]);
  }
  if (stdinFds[0])
  {
    ::close(stdinFds[0]);
    ::close(stdinFds[1]);
  }
  errno = err;
  return false;
#endif
}